

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O3

void __thiscall
QEGLPlatformContext::adopt
          (QEGLPlatformContext *this,EGLContext context,EGLDisplay display,
          QPlatformOpenGLContext *share)

{
  EGLConfig config;
  QSurfaceFormat *referenceFormat;
  int iVar1;
  QPlatformOpenGLContextPrivate *pQVar2;
  long in_FS_OFFSET;
  EGLConfig cfg;
  EGLint n;
  EGLint value;
  QSurfaceFormat local_68;
  QSurfaceFormat local_60;
  QSurfaceFormat *local_58;
  int local_4c;
  EGLenum local_48 [3];
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_eglDisplay = display;
  local_48[0] = 0;
  eglQueryContext(display,context,0x3028,local_48);
  local_4c = 0;
  local_58 = (QSurfaceFormat *)&DAT_aaaaaaaaaaaaaaaa;
  local_48[1] = 0x3028;
  local_48[2] = local_48[0];
  local_3c = 0x3038;
  iVar1 = eglChooseConfig(this->m_eglDisplay,local_48 + 1,&local_58,1);
  referenceFormat = local_58;
  if ((iVar1 == 0) || (local_4c != 1)) {
    adopt();
  }
  else {
    this->m_eglConfig = local_58;
    config = this->m_eglDisplay;
    QSurfaceFormat::QSurfaceFormat(&local_68);
    q_glFormatFromConfig(&local_60,config,referenceFormat);
    QSurfaceFormat::operator=(&this->m_format,&local_60);
    QSurfaceFormat::~QSurfaceFormat(&local_60);
    QSurfaceFormat::~QSurfaceFormat(&local_68);
  }
  local_48[0] = 0;
  eglQueryContext(this->m_eglDisplay,context,0x3097,local_48);
  if (local_48[0] != 0x30a2) {
    if (local_48[0] != 0x30a0) {
      adopt(this);
      goto LAB_0060a155;
    }
    QSurfaceFormat::setRenderableType(&this->m_format,OpenGLES);
  }
  this->m_api = local_48[0];
  eglBindAPI();
LAB_0060a155:
  this->m_eglContext = context;
  if (share == (QPlatformOpenGLContext *)0x0) {
    pQVar2 = (QPlatformOpenGLContextPrivate *)0x0;
  }
  else {
    pQVar2 = share[1].d_ptr.d;
  }
  this->m_shareContext = pQVar2;
  updateFormatFromGL(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEGLPlatformContext::adopt(EGLContext context, EGLDisplay display, QPlatformOpenGLContext *share)
{
    Q_ASSERT(!m_ownsContext);

    m_eglDisplay = display;

    // Figure out the EGLConfig.
    EGLint value = 0;
    eglQueryContext(m_eglDisplay, context, EGL_CONFIG_ID, &value);
    EGLint n = 0;
    EGLConfig cfg;
    const EGLint attribs[] = { EGL_CONFIG_ID, value, EGL_NONE };
    if (eglChooseConfig(m_eglDisplay, attribs, &cfg, 1, &n) && n == 1) {
        m_eglConfig = cfg;
        m_format = q_glFormatFromConfig(m_eglDisplay, m_eglConfig);
    } else {
        qWarning("QEGLPlatformContext: Failed to get framebuffer configuration for context");
    }

    // Fetch client API type.
    value = 0;
    eglQueryContext(m_eglDisplay, context, EGL_CONTEXT_CLIENT_TYPE, &value);
    if (value == EGL_OPENGL_API || value == EGL_OPENGL_ES_API) {
        // if EGL config supports both OpenGL and OpenGL ES render type,
        // q_glFormatFromConfig() with the default "referenceFormat" parameter
        // will always figure it out as OpenGL render type.
        // We can override it to match user's real render type.
        if (value == EGL_OPENGL_ES_API)
            m_format.setRenderableType(QSurfaceFormat::OpenGLES);
        m_api = value;
        eglBindAPI(m_api);
    } else {
        qWarning("QEGLPlatformContext: Failed to get client API type");
        m_api = EGL_OPENGL_ES_API;
    }

    m_eglContext = context;
    m_shareContext = share ? static_cast<QEGLPlatformContext *>(share)->m_eglContext : nullptr;
    updateFormatFromGL();
}